

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::EmbedParameter::EmbedParameter(EmbedParameter *this,EmbedParameter *from)

{
  void *pvVar1;
  uint32 uVar2;
  uint uVar3;
  FillerParameter *pFVar4;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EmbedParameter_00760980;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar3 = (from->_has_bits_).has_bits_[0];
  if ((uVar3 & 1) == 0) {
    this->weight_filler_ = (FillerParameter *)0x0;
  }
  else {
    pFVar4 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar4,from->weight_filler_);
    this->weight_filler_ = pFVar4;
    uVar3 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar3 & 2) == 0) {
    pFVar4 = (FillerParameter *)0x0;
  }
  else {
    pFVar4 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(pFVar4,from->bias_filler_);
  }
  this->bias_filler_ = pFVar4;
  uVar2 = from->input_dim_;
  this->num_output_ = from->num_output_;
  this->input_dim_ = uVar2;
  this->bias_term_ = from->bias_term_;
  return;
}

Assistant:

EmbedParameter::EmbedParameter(const EmbedParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weight_filler()) {
    weight_filler_ = new ::caffe::FillerParameter(*from.weight_filler_);
  } else {
    weight_filler_ = NULL;
  }
  if (from.has_bias_filler()) {
    bias_filler_ = new ::caffe::FillerParameter(*from.bias_filler_);
  } else {
    bias_filler_ = NULL;
  }
  ::memcpy(&num_output_, &from.num_output_,
    reinterpret_cast<char*>(&bias_term_) -
    reinterpret_cast<char*>(&num_output_) + sizeof(bias_term_));
  // @@protoc_insertion_point(copy_constructor:caffe.EmbedParameter)
}